

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault.cc
# Opt level: O0

void __thiscall kratos::FaultAnalyzer::FaultAnalyzer(FaultAnalyzer *this,Generator *generator)

{
  Generator *generator_local;
  FaultAnalyzer *this_local;
  
  this->generator_ = generator;
  std::
  vector<std::shared_ptr<kratos::SimulationRun>,_std::allocator<std::shared_ptr<kratos::SimulationRun>_>_>
  ::vector(&this->runs_);
  std::
  unordered_map<unsigned_int,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>_>
  ::unordered_map(&this->coverage_maps_);
  return;
}

Assistant:

FaultAnalyzer::FaultAnalyzer(kratos::Generator *generator) : generator_(generator) {}